

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_area_ratio_to_parcor_coefficients.cc
# Opt level: O3

bool __thiscall
sptk::LogAreaRatioToParcorCoefficients::Run
          (LogAreaRatioToParcorCoefficients *this,
          vector<double,_std::allocator<double>_> *log_area_ratio,
          vector<double,_std::allocator<double>_> *parcor_coefficients)

{
  double *pdVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  double *pdVar5;
  size_type __new_size;
  double *pdVar6;
  double dVar7;
  
  if (this->is_valid_ == true) {
    bVar4 = false;
    if (parcor_coefficients != (vector<double,_std::allocator<double>_> *)0x0) {
      iVar2 = this->num_order_;
      pdVar6 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = (long)(log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar6;
      __new_size = lVar3 >> 3;
      bVar4 = false;
      if (__new_size == (long)iVar2 + 1U) {
        pdVar5 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                  .super__Vector_impl_data._M_finish - (long)pdVar5 != lVar3) {
          std::vector<double,_std::allocator<double>_>::resize(parcor_coefficients,__new_size);
          pdVar6 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar2 = this->num_order_;
        }
        *pdVar5 = *pdVar6;
        bVar4 = true;
        if (iVar2 != 0) {
          pdVar1 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          while (pdVar6 = pdVar6 + 1, pdVar6 != pdVar1) {
            pdVar5 = pdVar5 + 1;
            dVar7 = tanh(*pdVar6 * 0.5);
            *pdVar5 = dVar7;
          }
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool LogAreaRatioToParcorCoefficients::Run(
    const std::vector<double>& log_area_ratio,
    std::vector<double>* parcor_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || log_area_ratio.size() != static_cast<std::size_t>(length) ||
      NULL == parcor_coefficients) {
    return false;
  }

  // Prepare memories.
  if (parcor_coefficients->size() != static_cast<std::size_t>(length)) {
    parcor_coefficients->resize(length);
  }

  // Copy gain.
  (*parcor_coefficients)[0] = log_area_ratio[0];
  if (0 == num_order_) {
    return true;
  }

  std::transform(log_area_ratio.begin() + 1, log_area_ratio.end(),
                 parcor_coefficients->begin() + 1,
                 [](double g) { return std::tanh(0.5 * g); });

  return true;
}